

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.h
# Opt level: O0

GdlRule * __thiscall GdlPass::NewRule(GdlPass *this,GrpLineAndFile *lnf)

{
  GdlRule *this_00;
  GrpLineAndFile *in_RDI;
  GdlRule *pruleNew;
  value_type *in_stack_ffffffffffffffd8;
  vector<GdlRule_*,_std::allocator<GdlRule_*>_> *in_stack_ffffffffffffffe0;
  
  this_00 = (GdlRule *)operator_new(0x128);
  GdlRule::GdlRule(this_00);
  GdlObject::SetLineAndFile(&this_00->super_GdlObject,in_RDI);
  std::vector<GdlRule_*,_std::allocator<GdlRule_*>_>::push_back
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return this_00;
}

Assistant:

GdlRule * NewRule(GrpLineAndFile & lnf)
	{
		GdlRule * pruleNew = new GdlRule();
		pruleNew->SetLineAndFile(lnf);
		m_vprule.push_back(pruleNew);
		return pruleNew;
	}